

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::SetCVRow(ON_NurbsSurface *this,int row_index,ON_3dPoint *point)

{
  bool bVar1;
  int i;
  bool bVar2;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  if (row_index < 0) {
    bVar2 = false;
  }
  else {
    i = 0;
    bVar2 = false;
    if (row_index <= this->m_cv_count[1]) {
      do {
        bVar2 = this->m_cv_count[0] <= i;
        if (this->m_cv_count[0] <= i) {
          return bVar2;
        }
        bVar1 = SetCV(this,i,row_index,point);
        i = i + 1;
      } while (bVar1);
    }
  }
  return bVar2;
}

Assistant:

bool ON_NurbsSurface::SetCVRow(
       int row_index,
       const ON_3dPoint& point
       )
{
  DestroySurfaceTree();
  int i;

  if ( row_index < 0 || row_index > m_cv_count[1] )
    return false;

  for ( i = 0; i < m_cv_count[0]; i++ ) {
    if ( !SetCV( i, row_index, point ) )
      return false;
  }

  return true;
}